

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O0

void Ivy_GraphUpdateNetworkSeq(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Dec_Graph_t *pGraph,int nGain)

{
  int iVar1;
  int iVar2;
  Ivy_Obj_t *pObjNew;
  int nNodesOld;
  int nNodesNew;
  Ivy_Obj_t *pRootNew;
  int nGain_local;
  Dec_Graph_t *pGraph_local;
  Ivy_Obj_t *pRoot_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_ManNodeNum(p);
  pObjNew = Ivy_GraphToNetworkSeq(p,pGraph);
  Ivy_ObjReplace(p,pRoot,pObjNew,1,0,0);
  iVar2 = Ivy_ManNodeNum(p);
  if (nGain <= iVar1 - iVar2) {
    Ivy_ManPropagateBuffers(p,0);
    return;
  }
  __assert_fail("nGain <= nNodesOld - nNodesNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivySeq.c"
                ,0x218,
                "void Ivy_GraphUpdateNetworkSeq(Ivy_Man_t *, Ivy_Obj_t *, Dec_Graph_t *, int)");
}

Assistant:

void Ivy_GraphUpdateNetworkSeq( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Dec_Graph_t * pGraph, int nGain )
{
    Ivy_Obj_t * pRootNew;
    int nNodesNew, nNodesOld;
    nNodesOld = Ivy_ManNodeNum(p);
    // create the new structure of nodes
    pRootNew = Ivy_GraphToNetworkSeq( p, pGraph );
    Ivy_ObjReplace( p, pRoot, pRootNew, 1, 0, 0 );
    // compare the gains
    nNodesNew = Ivy_ManNodeNum(p);
    assert( nGain <= nNodesOld - nNodesNew );
    // propagate the buffer
    Ivy_ManPropagateBuffers( p, 0 );
}